

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O3

bool remove_obj(CHAR_DATA *ch,int iWear,bool fReplace)

{
  OBJ_DATA *obj;
  OBJ_DATA *obj_00;
  OBJ_DATA *obj_01;
  char *pcVar1;
  bool bVar2;
  double dVar3;
  
  obj = get_eq_char(ch,iWear);
  bVar2 = obj == (OBJ_DATA *)0x0 || iWear == 0x15;
  if (fReplace && (obj != (OBJ_DATA *)0x0 && iWear != 0x15)) {
    if ((obj->extra_flags[0] & 0x1000) != 0) {
      act("You can\'t remove $p.",ch,obj,(void *)0x0,3);
      bVar2 = is_immortal(ch);
      if (!bVar2) {
        return false;
      }
    }
    bVar2 = is_affected_obj(obj,(int)gsn_rust);
    if (bVar2) {
      pcVar1 = "$p is covered with rust and can\'t be pried off!";
    }
    else {
      if ((iWear == 0x10) && (bVar2 = is_affected(ch,(int)gsn_unbreakable), bVar2)) {
        act("$p is frozen to your hand!",ch,obj,(void *)0x0,3);
        bVar2 = is_immortal(ch);
        if (!bVar2) {
          return false;
        }
      }
      bVar2 = check_entwine(ch,1);
      if ((((!bVar2) || (0x12 < (uint)iWear)) || ((0x60800U >> (iWear & 0x1fU) & 1) == 0)) &&
         ((bVar2 = check_entwine(ch,0), iWear != 0x10 || (!bVar2)))) {
        obj_00 = get_eq_char(ch,0x12);
        unequip_char(ch,obj,true);
        if (iWear == 0x12) {
          act("$n stops dual wielding $p.",ch,obj,(void *)0x0,0);
          act("You stop dual wielding $p.",ch,obj,(void *)0x0,3);
          return true;
        }
        obj_01 = ch->carrying;
        do {
          if (obj_01 == (OBJ_DATA *)0x0) {
            act("$n removes $p.",ch,obj,(void *)0x0,0);
            pcVar1 = "You remove $p.";
            obj_01 = (OBJ_DATA *)0x0;
LAB_0025cbed:
            act(pcVar1,ch,obj,obj_01,3);
            if (obj_00 == (OBJ_DATA *)0x0 || iWear != 0x10) {
              return true;
            }
            unequip_char(ch,obj_00,false);
            act("You swap $p into your primary hand.",ch,obj_00,(void *)0x0,3);
            act("$n swaps $p into $s primary hand.",ch,obj_00,(void *)0x0,0);
            equip_char(ch,obj_00,0x10,false);
            return true;
          }
          bVar2 = is_worn(obj_01);
          if (((bVar2) && (bVar2 = can_wear(obj_01,0x12), bVar2)) &&
             ((obj_01->extra_flags[0] & 0x200000) != 0)) {
            dVar3 = (double)obj_01->wear_flags[0] + -262144.0;
            if ((dVar3 == (double)obj->wear_flags[0]) &&
               (!NAN(dVar3) && !NAN((double)obj->wear_flags[0]))) {
              act("$n removes $p, revealing $P underneath.",ch,obj,obj_01,0);
              pcVar1 = "You remove $p, revealing $P underneath.";
              goto LAB_0025cbed;
            }
          }
          obj_01 = obj_01->next_content;
        } while( true );
      }
      pcVar1 = "You can\'t remove $p.";
    }
    bVar2 = false;
    act(pcVar1,ch,obj,(void *)0x0,3);
  }
  return bVar2;
}

Assistant:

bool remove_obj(CHAR_DATA *ch, int iWear, bool fReplace)
{
	OBJ_DATA *obj, *secondary, *revealed;

	obj = get_eq_char(ch, iWear);

	if (iWear == WEAR_COSMETIC || obj == nullptr)
		return true;

	if (!fReplace)
		return false;

	if (IS_SET(obj->extra_flags, ITEM_NOREMOVE))
	{
		act("You can't remove $p.", ch, obj, nullptr, TO_CHAR);

		if (!is_immortal(ch))
			return false;
	}

	if (is_affected_obj(obj, gsn_rust))
	{
		act("$p is covered with rust and can't be pried off!", ch, obj, 0, TO_CHAR);
		return false;
	}

	if (iWear == WEAR_WIELD && is_affected(ch, gsn_unbreakable))
	{
		act("$p is frozen to your hand!", ch, obj, nullptr, TO_CHAR);

		if (!is_immortal(ch))
			return false;
	}

	if (check_entwine(ch, 1) && (iWear == WEAR_DUAL_WIELD || iWear == WEAR_SHIELD || iWear == WEAR_HOLD))
	{
		act("You can't remove $p.", ch, obj, nullptr, TO_CHAR);
		return false;
	}

	if (check_entwine(ch, 0) && (iWear == WEAR_WIELD))
	{
		act("You can't remove $p.", ch, obj, nullptr, TO_CHAR);
		return false;
	}

	secondary = get_eq_char(ch, WEAR_DUAL_WIELD);

	unequip_char(ch, obj, true);

	if (iWear == WEAR_DUAL_WIELD)
	{
		act("$n stops dual wielding $p.", ch, obj, 0, TO_ROOM);
		act("You stop dual wielding $p.", ch, obj, 0, TO_CHAR);
		return true;
	}

	for (revealed = ch->carrying; revealed; revealed = revealed->next_content)
	{
		if (is_worn(revealed) && can_wear(revealed, ITEM_WEAR_COSMETIC))
		{
			if (IS_SET(revealed->extra_flags, ITEM_UNDER_CLOTHES))
			{
				if (revealed->wear_flags[0] - pow(2, ITEM_WEAR_COSMETIC) == obj->wear_flags[0])
					break;
			}
		}
	}

	if (revealed)
	{
		act("$n removes $p, revealing $P underneath.", ch, obj, revealed, TO_ROOM);
		act("You remove $p, revealing $P underneath.", ch, obj, revealed, TO_CHAR);
	}
	else
	{
		act("$n removes $p.", ch, obj, nullptr, TO_ROOM);
		act("You remove $p.", ch, obj, nullptr, TO_CHAR);
	}

	if (iWear == WEAR_WIELD && secondary != nullptr)
	{
		unequip_char(ch, secondary, false);
		act("You swap $p into your primary hand.", ch, secondary, nullptr, TO_CHAR);
		act("$n swaps $p into $s primary hand.", ch, secondary, nullptr, TO_ROOM);
		equip_char(ch, secondary, WEAR_WIELD, false);
	}

	return true;
}